

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadElemSection(BinaryReader *this,Offset section_size)

{
  ExternalKind EVar1;
  int iVar2;
  Result RVar3;
  uint uVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  Index IVar5;
  char *pcVar6;
  ExternalKind EVar7;
  ulong uVar8;
  Index IVar9;
  ulong uVar10;
  uint32_t flags;
  Index num_elem_exprs;
  Type elem_type;
  Index num_elem_segments;
  uint32_t value;
  uint local_68;
  ExternalKind local_64;
  Type local_60;
  uint local_58;
  uint local_54;
  string local_50;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])();
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_54,"elem segment count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])(this->delegate_,(ulong)local_54);
      if (iVar2 == 0) {
        if (local_54 != 0) {
          uVar10 = 0;
          local_58 = local_54;
          do {
            RVar3 = ReadU32Leb128(this,&local_68,"elem segment flags");
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            if (7 < local_68) {
              PrintError(this,"invalid elem segment flags: %#x");
              return (Result)Error;
            }
            uVar4 = 0;
            if (((local_68 & 3) == 2) &&
               (RVar3 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem segment table index"),
               uVar4 = (uint)local_50._M_dataplus._M_p, RVar3.enum_ == Error)) {
              return (Result)Error;
            }
            local_60.enum_ = FuncRef;
            local_60.type_index_ = 0;
            IVar9 = (Index)uVar10;
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                              (this->delegate_,uVar10,(ulong)uVar4,(ulong)local_68 & 0xff);
            if (iVar2 != 0) {
              pcVar6 = "BeginElemSegment callback failed";
              goto LAB_001261a8;
            }
            pcVar6 = extraout_RDX;
            if ((local_68 & 1) == 0) {
              IVar5 = IVar9;
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])();
              if (iVar2 != 0) {
                pcVar6 = "BeginElemSegmentInitExpr callback failed";
                goto LAB_001261a8;
              }
              RVar3 = ReadInitExpr(this,IVar5);
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])(this->delegate_,uVar10);
              pcVar6 = extraout_RDX_00;
              if (iVar2 != 0) {
                pcVar6 = "EndElemSegmentInitExpr callback failed";
                goto LAB_001261a8;
              }
            }
            if ((local_68 & 3) != 0) {
              if ((local_68 & 4) == 0) {
                RVar3 = ReadExternalKind(this,&local_64,pcVar6);
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                if (local_64 != First) {
                  Type::GetName_abi_cxx11_(&local_50,&local_60);
                  PrintError(this,"segment elem type must be func (%s)",
                             CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      (uint)local_50._M_dataplus._M_p));
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(uint)local_50._M_dataplus._M_p)
                      == &local_50.field_2) {
                    return (Result)Error;
                  }
                  operator_delete((undefined1 *)
                                  CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                           (uint)local_50._M_dataplus._M_p),
                                  local_50.field_2._M_allocated_capacity + 1);
                  return (Result)Error;
                }
                local_60.enum_ = FuncRef;
                local_60.type_index_ = 0;
              }
              else {
                RVar3 = ReadRefType(this,&local_60,"table elem type");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
              }
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x96])
                              (this->delegate_,uVar10,local_60);
            if (iVar2 != 0) {
              pcVar6 = "OnElemSegmentElemType callback failed";
              goto LAB_001261a8;
            }
            RVar3 = ReadCount(this,&local_64,"elem count");
            EVar1 = local_64;
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x97])
                              (this->delegate_,uVar10,(ulong)local_64);
            if (iVar2 != 0) {
              pcVar6 = "OnElemSegmentElemExprCount callback failed";
              goto LAB_001261a8;
            }
            if (EVar1 != First) {
              uVar8 = 0;
              do {
                IVar5 = IVar9;
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x98])
                                  (this->delegate_,uVar10,uVar8);
                if (iVar2 != 0) {
                  pcVar6 = "BeginElemExpr callback failed";
                  goto LAB_001261a8;
                }
                if ((local_68 & 4) == 0) {
                  RVar3 = ReadU32Leb128(this,(uint32_t *)&local_50,"elem expr func index");
                  uVar4 = (uint)local_50._M_dataplus._M_p;
                  if (RVar3.enum_ == Error) {
                    return (Result)Error;
                  }
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x38])(this->delegate_,0xdd)
                  ;
                  if (iVar2 != 0) {
                    pcVar6 = "OnOpcode callback failed";
                    goto LAB_001261a8;
                  }
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x78])
                                    (this->delegate_,(ulong)uVar4);
                  if (iVar2 != 0) {
                    pcVar6 = "OnRefFuncExpr callback failed";
                    goto LAB_001261a8;
                  }
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x3a])
                                    (this->delegate_,(ulong)uVar4);
                  if (iVar2 != 0) {
                    pcVar6 = "OnOpcodeUint32 callback failed";
                    goto LAB_001261a8;
                  }
                  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x5c])();
                  if (iVar2 != 0) {
                    pcVar6 = "OnEndExpr callback failed";
                    goto LAB_001261a8;
                  }
                }
                else {
                  RVar3 = ReadInitExpr(this,IVar5);
                  if (RVar3.enum_ == Error) {
                    return (Result)Error;
                  }
                }
                iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x99])
                                  (this->delegate_,uVar10,uVar8);
                if (iVar2 != 0) {
                  pcVar6 = "EndElemExpr callback failed";
                  goto LAB_001261a8;
                }
                EVar7 = (int)uVar8 + Table;
                uVar8 = (ulong)EVar7;
              } while (EVar1 != EVar7);
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9a])(this->delegate_,uVar10);
            if (iVar2 != 0) {
              pcVar6 = "EndElemSegment callback failed";
              goto LAB_001261a8;
            }
            uVar10 = (ulong)(IVar9 + 1);
          } while (IVar9 + 1 != local_58);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9b])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        pcVar6 = "EndElemSection callback failed";
      }
      else {
        pcVar6 = "OnElemSegmentCount callback failed";
      }
LAB_001261a8:
      PrintError(this,pcVar6);
    }
  }
  else {
    PrintError(this,"BeginElemSection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadElemSection(Offset section_size) {
  CALLBACK(BeginElemSection, section_size);
  Index num_elem_segments;
  CHECK_RESULT(ReadCount(&num_elem_segments, "elem segment count"));
  CALLBACK(OnElemSegmentCount, num_elem_segments);
  for (Index i = 0; i < num_elem_segments; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "elem segment flags"));
    ERROR_IF(flags > SegFlagMax, "invalid elem segment flags: %#x", flags);
    Index table_index(0);
    if ((flags & (SegPassive | SegExplicitIndex)) == SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&table_index, "elem segment table index"));
    }
    Type elem_type = Type::FuncRef;

    CALLBACK(BeginElemSegment, i, table_index, flags);

    if (!(flags & SegPassive)) {
      CALLBACK(BeginElemSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndElemSegmentInitExpr, i);
    }

    // For backwards compat we support not declaring the element kind.
    if (flags & (SegPassive | SegExplicitIndex)) {
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadRefType(&elem_type, "table elem type"));
      } else {
        ExternalKind kind;
        CHECK_RESULT(ReadExternalKind(&kind, "export kind"));
        ERROR_UNLESS(kind == ExternalKind::Func,
                     "segment elem type must be func (%s)",
                     elem_type.GetName().c_str());
        elem_type = Type::FuncRef;
      }
    }

    CALLBACK(OnElemSegmentElemType, i, elem_type);

    Index num_elem_exprs;
    CHECK_RESULT(ReadCount(&num_elem_exprs, "elem count"));

    CALLBACK(OnElemSegmentElemExprCount, i, num_elem_exprs);
    for (Index j = 0; j < num_elem_exprs; ++j) {
      CALLBACK(BeginElemExpr, i, j);
      if (flags & SegUseElemExprs) {
        CHECK_RESULT(ReadInitExpr(j));
      } else {
        Index func_index;
        CHECK_RESULT(ReadIndex(&func_index, "elem expr func index"));
        CALLBACK(OnOpcode, Opcode::RefFunc);
        CALLBACK(OnRefFuncExpr, func_index);
        CALLBACK(OnOpcodeUint32, func_index);
        CALLBACK0(OnEndExpr);
      }
      CALLBACK(EndElemExpr, i, j);
    }
    CALLBACK(EndElemSegment, i);
  }
  CALLBACK0(EndElemSection);
  return Result::Ok;
}